

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::AnyTest_TestUnpackWithTypeMismatch_Test::
AnyTest_TestUnpackWithTypeMismatch_Test(AnyTest_TestUnpackWithTypeMismatch_Test *this)

{
  AnyTest_TestUnpackWithTypeMismatch_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__AnyTest_TestUnpackWithTypeMismatch_Test_0299dc00;
  return;
}

Assistant:

TEST(AnyTest, TestUnpackWithTypeMismatch) {
  proto2_unittest::TestAny payload;
  payload.set_int32_value(13);
  google::protobuf::Any any;
  any.PackFrom(payload);

  // Attempt to unpack into the wrong type.
  proto2_unittest::TestAllTypes dest;
  EXPECT_FALSE(any.UnpackTo(&dest));
}